

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O2

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderBytes
          (JsonObjectWriter *this,StringPiece name,StringPiece value)

{
  char *pcVar1;
  string *this_00;
  string *dest;
  StringPiece src;
  StringPiece src_00;
  string local_70;
  undefined1 local_50 [8];
  StringPiece value_local;
  string base64;
  
  this_00 = (string *)value.ptr_;
  dest = this_00;
  local_50 = (undefined1  [8])this_00;
  value_local.ptr_ = (char *)value.length_;
  WritePrefix(this,name);
  value_local.length_ = (stringpiece_ssize_type)&base64._M_string_length;
  base64._M_dataplus._M_p = (pointer)0x0;
  base64._M_string_length._0_1_ = 0;
  if (this->use_websafe_base64_for_bytes_ == true) {
    StringPiece::ToString_abi_cxx11_(&local_70,(StringPiece *)local_50);
    pcVar1 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
    src.length_ = (stringpiece_ssize_type)&value_local.length_;
    src.ptr_ = pcVar1;
    WebSafeBase64EscapeWithPadding((protobuf *)local_70._M_dataplus._M_p,src,dest);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    src_00.length_ = (stringpiece_ssize_type)&value_local.length_;
    src_00.ptr_ = (char *)value.length_;
    Base64Escape((protobuf *)this_00,src_00,dest);
  }
  WriteChar(this,'\"');
  io::CodedOutputStream::WriteRaw
            (this->stream_,(void *)value_local.length_,(int)base64._M_dataplus._M_p);
  WriteChar(this,'\"');
  std::__cxx11::string::~string((string *)&value_local.length_);
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderBytes(StringPiece name,
                                                StringPiece value) {
  WritePrefix(name);
  std::string base64;

  if (use_websafe_base64_for_bytes_)
    WebSafeBase64EscapeWithPadding(value.ToString(), &base64);
  else
    Base64Escape(value, &base64);

  WriteChar('"');
  // TODO(wpoon): Consider a ByteSink solution that writes the base64 bytes
  //              directly to the stream, rather than first putting them
  //              into a string and then writing them to the stream.
  stream_->WriteRaw(base64.data(), base64.size());
  WriteChar('"');
  return this;
}